

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

string * __thiscall
(anonymous_namespace)::AtomicBenchmark<(std::memory_order)5>::GetName_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  allocator<char> local_9;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"Atomic Benchmark (",&local_9);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]]
  std::string GetName() const noexcept override {
    std::string name = "Atomic Benchmark (";
    name.append(GetMemoryOrderRepr(Order));
    name.append(")");
    return name;
  }